

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# esextcTextureBorderClampSamplingTexture.cpp
# Opt level: O2

string * __thiscall
glcts::TextureBorderClampSamplingTexture<int,int>::getVertexShaderCode_abi_cxx11_
          (string *__return_storage_ptr__,void *this)

{
  int iVar1;
  ostream *poVar2;
  TestError *this_00;
  string coordType;
  string coordAssignment;
  stringstream result;
  ostream local_188;
  
  std::__cxx11::stringstream::stringstream((stringstream *)&result);
  coordType._M_dataplus._M_p = (pointer)&coordType.field_2;
  coordType._M_string_length = 0;
  coordAssignment._M_dataplus._M_p = (pointer)&coordAssignment.field_2;
  coordAssignment._M_string_length = 0;
  coordType.field_2._M_local_buf[0] = '\0';
  coordAssignment.field_2._M_local_buf[0] = '\0';
  iVar1 = *(int *)((long)this + 0x2d8);
  if ((iVar1 == 0x8c1a) || (iVar1 == 0x806f)) {
    std::__cxx11::string::assign((char *)&coordType);
  }
  else {
    if (iVar1 != 0xde1) {
      this_00 = (TestError *)__cxa_allocate_exception(0x38);
      tcu::TestError::TestError
                (this_00,"Not allowed texture target!",fixed_sample_locations_values + 1,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/texture_border_clamp/esextcTextureBorderClampSamplingTexture.cpp"
                 ,0x37c);
      __cxa_throw(this_00,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
    }
    std::__cxx11::string::assign((char *)&coordType);
  }
  std::__cxx11::string::assign((char *)&coordAssignment);
  poVar2 = std::operator<<(&local_188,
                           "${VERSION}\n\nprecision highp float;\n\nlayout (location = 0) in vec4 vertex_position_in;\nlayout (location = 1) in vec2 texture_coords_in;\nout "
                          );
  poVar2 = std::operator<<(poVar2,(string *)&coordType);
  poVar2 = std::operator<<(poVar2,
                           " texture_coords_out;\nuniform float layer;\n\nvoid main()\n{\n    gl_Position = vertex_position_in;\n    texture_coords_out = "
                          );
  poVar2 = std::operator<<(poVar2,(string *)&coordAssignment);
  std::operator<<(poVar2,";\n}\n");
  std::__cxx11::stringbuf::str();
  std::__cxx11::string::~string((string *)&coordAssignment);
  std::__cxx11::string::~string((string *)&coordType);
  std::__cxx11::stringstream::~stringstream((stringstream *)&result);
  return __return_storage_ptr__;
}

Assistant:

std::string TextureBorderClampSamplingTexture<InputType, OutputType>::getVertexShaderCode(void)
{
	std::stringstream result;
	std::string		  coordType;
	std::string		  coordAssignment;

	/* Check input texture target and prepare approperiate coordinate type and coordinate assignment method */
	switch (m_test_configuration.get_target())
	{
	case GL_TEXTURE_2D:
		coordType		= "vec2";
		coordAssignment = "texture_coords_in";
		break;

	case GL_TEXTURE_2D_ARRAY:
	case GL_TEXTURE_3D:
		coordType		= "vec3";
		coordAssignment = "vec3(texture_coords_in, layer)";
		break;

	default:
		throw tcu::TestError("Not allowed texture target!", "", __FILE__, __LINE__);
	}

	result << "${VERSION}\n"
			  "\n"
			  "precision highp float;\n"
			  "\n"
			  "layout (location = 0) in vec4 vertex_position_in;\n"
			  "layout (location = 1) in vec2 texture_coords_in;\n"
			  "out "
		   << coordType << " texture_coords_out;\n"
						   "uniform float layer;\n"
						   "\n"
						   "void main()\n"
						   "{\n"
						   "    gl_Position = vertex_position_in;\n"
						   "    texture_coords_out = "
		   << coordAssignment << ";\n"
								 "}\n";

	return result.str();
}